

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_manager.hpp
# Opt level: O0

void __thiscall
duckdb::BlockManager::SetBlockAllocSize(BlockManager *this,optional_idx block_alloc_size_p)

{
  bool bVar1;
  string *msg;
  long in_RDI;
  allocator *this_00;
  undefined8 local_50;
  allocator local_31;
  string local_30 [8];
  idx_t in_stack_ffffffffffffffd8;
  optional_idx *in_stack_ffffffffffffffe0;
  
  bVar1 = optional_idx::IsValid((optional_idx *)(in_RDI + 0x78));
  if (!bVar1) {
    optional_idx::GetIndex(in_stack_ffffffffffffffe0);
    optional_idx::optional_idx(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    *(undefined8 *)(in_RDI + 0x78) = local_50;
    return;
  }
  msg = (string *)__cxa_allocate_exception(0x10);
  this_00 = &local_31;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_30,"the block allocation size must be set once",this_00);
  InternalException::InternalException((InternalException *)this_00,msg);
  __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

void SetBlockAllocSize(const optional_idx block_alloc_size_p) {
		if (block_alloc_size.IsValid()) {
			throw InternalException("the block allocation size must be set once");
		}
		block_alloc_size = block_alloc_size_p.GetIndex();
	}